

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O3

void Amap_RemoveComments(char *pBuffer,int *pnDots,int *pnLines)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *pCur;
  byte *pbVar5;
  
  iVar4 = 0;
  iVar3 = 0;
  do {
    bVar2 = *pBuffer;
    if (bVar2 < 0x23) {
      if (bVar2 == 10) {
LAB_00446a45:
        if (((byte *)pBuffer)[-1] == 0x5c) {
          ((byte *)pBuffer)[-1] = 0x20;
          ((byte *)pBuffer)[0] = 0x20;
        }
        else if ((((byte *)pBuffer)[-1] == 0xd) && (((byte *)pBuffer)[-2] == 0x5c)) {
          ((byte *)pBuffer)[-2] = 0x20;
          ((byte *)pBuffer)[-1] = 0x20;
          *pBuffer = 0x20;
        }
        else {
          iVar3 = iVar3 + 1;
        }
      }
      else if (bVar2 == 0) {
        if (pnDots != (int *)0x0) {
          *pnDots = iVar4;
        }
        if (pnLines != (int *)0x0) {
          *pnLines = iVar3;
        }
        return;
      }
    }
    else if (bVar2 == 0x2e) {
      iVar4 = iVar4 + 1;
    }
    else {
      pbVar5 = (byte *)pBuffer;
      if (bVar2 == 0x23) {
        do {
          pBuffer = (char *)(pbVar5 + 1);
          *pbVar5 = 0x20;
          pbVar1 = pbVar5 + 1;
          pbVar5 = (byte *)pBuffer;
        } while (*pbVar1 != 10);
        goto LAB_00446a45;
      }
    }
    pBuffer = (char *)((byte *)pBuffer + 1);
  } while( true );
}

Assistant:

void Amap_RemoveComments( char * pBuffer, int * pnDots, int * pnLines )
{
    char * pCur;
    int nDots, nLines;
    // scan through the buffer and eliminate comments
    // (in the BLIF file, comments are lines starting with "#")
    nDots = nLines = 0;
    for ( pCur = pBuffer; *pCur; pCur++ )
    {
        // if this is the beginning of comment
        // clean it with spaces until the new line statement
        if ( *pCur == '#' )
            while ( *pCur != '\n' )
                *pCur++ = ' ';
    
        // count the number of new lines and dots
        if ( *pCur == '\n' ) {
        if (*(pCur-1)=='\r') {
        // DOS(R) file support
        if (*(pCur-2)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-2) = ' ';
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        } else {
        // UNIX(TM) file support
        if (*(pCur-1)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        }
    }
        else if ( *pCur == '.' )
            nDots++;
    }
    if ( pnDots )
        *pnDots = nDots; 
    if ( pnLines )
        *pnLines = nLines; 
}